

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndPopup(void)

{
  ImGuiContext *g;
  ImGuiNavMoveFlags in_stack_0000001c;
  ImGuiWindow *in_stack_00000020;
  
  NavMoveRequestTryWrapping(in_stack_00000020,in_stack_0000001c);
  End();
  return;
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui; (void)g;
    IM_ASSERT(g.CurrentWindow->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.BeginPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy.
    NavMoveRequestTryWrapping(g.CurrentWindow, ImGuiNavMoveFlags_LoopY);

    End();
}